

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui_initgamedialog.h
# Opt level: O0

void __thiscall Ui_InitGameDialog::setupUi(Ui_InitGameDialog *this,QDialog *InitGameDialog)

{
  QWidget *pQVar1;
  QDialog *pQVar2;
  bool bVar3;
  QGridLayout *pQVar4;
  QLabel *pQVar5;
  QLineEdit *pQVar6;
  QDialogButtonBox *pQVar7;
  QSpinBox *pQVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  QByteArrayView QVar16;
  QByteArrayView QVar17;
  Object local_230 [8];
  Function local_228;
  code *local_218;
  undefined8 local_210;
  undefined8 local_208;
  undefined8 local_200;
  Object local_1f8 [12];
  QFlags<Qt::AlignmentFlag> local_1ec;
  QByteArrayView local_1e8;
  QString local_1d8;
  QFlags<Qt::AlignmentFlag> local_1bc;
  QByteArrayView local_1b8;
  QString local_1a8;
  QFlags<Qt::WindowType> local_18c;
  QFlags<Qt::AlignmentFlag> local_188;
  Int local_184;
  QByteArrayView local_180;
  QString local_170;
  QFlags<Qt::AlignmentFlag> local_154;
  QByteArrayView local_150;
  QString local_140;
  QFlags<Qt::AlignmentFlag> local_124;
  QByteArrayView local_120;
  QString local_110;
  QFlags<Qt::WindowType> local_f8;
  QFlags<Qt::AlignmentFlag> local_f4;
  QByteArrayView local_f0;
  QString local_e0;
  QFlags<Qt::AlignmentFlag> local_c4;
  QByteArrayView local_c0;
  QString local_b0;
  QFlags<Qt::WindowType> local_94;
  QByteArrayView local_90;
  QString local_80;
  QByteArrayView local_68;
  QString local_58;
  QString local_30;
  QDialog *local_18;
  QDialog *InitGameDialog_local;
  Ui_InitGameDialog *this_local;
  
  local_18 = InitGameDialog;
  InitGameDialog_local = (QDialog *)this;
  QObject::objectName();
  bVar3 = QString::isEmpty(&local_30);
  QString::~QString(&local_30);
  pQVar2 = local_18;
  if (bVar3) {
    QByteArrayView::QByteArrayView<15ul>(&local_68,(char (*) [15])"InitGameDialog");
    QVar9.m_data = (storage_type *)local_68.m_size;
    QVar9.m_size = (qsizetype)&local_58;
    QString::fromUtf8(QVar9);
    QObject::setObjectName((QString *)pQVar2);
    QString::~QString(&local_58);
  }
  QWidget::resize((QWidget *)local_18,400,300);
  pQVar4 = (QGridLayout *)operator_new(0x20);
  QGridLayout::QGridLayout(pQVar4,(QWidget *)local_18);
  this->gridLayout = pQVar4;
  pQVar4 = this->gridLayout;
  QByteArrayView::QByteArrayView<11ul>(&local_90,(char (*) [11])"gridLayout");
  QVar10.m_data = (storage_type *)local_90.m_size;
  QVar10.m_size = (qsizetype)&local_80;
  QString::fromUtf8(QVar10);
  QObject::setObjectName((QString *)pQVar4);
  QString::~QString(&local_80);
  pQVar5 = (QLabel *)operator_new(0x28);
  pQVar2 = local_18;
  QFlags<Qt::WindowType>::QFlags(&local_94);
  QLabel::QLabel(pQVar5,(QWidget *)pQVar2,(QFlags_conflict *)(ulong)local_94.i);
  this->player1Label = pQVar5;
  pQVar5 = this->player1Label;
  QByteArrayView::QByteArrayView<13ul>(&local_c0,(char (*) [13])"player1Label");
  QVar11.m_data = (storage_type *)local_c0.m_size;
  QVar11.m_size = (qsizetype)&local_b0;
  QString::fromUtf8(QVar11);
  QObject::setObjectName((QString *)pQVar5);
  QString::~QString(&local_b0);
  pQVar1 = (QWidget *)this->gridLayout;
  pQVar5 = this->player1Label;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_c4);
  QGridLayout::addWidget(pQVar1,(int)pQVar5,0,1,1,(QFlags_conflict *)0x1);
  pQVar6 = (QLineEdit *)operator_new(0x28);
  QLineEdit::QLineEdit(pQVar6,(QWidget *)local_18);
  this->editPlayer1 = pQVar6;
  pQVar6 = this->editPlayer1;
  QByteArrayView::QByteArrayView<12ul>(&local_f0,(char (*) [12])"editPlayer1");
  QVar12.m_data = (storage_type *)local_f0.m_size;
  QVar12.m_size = (qsizetype)&local_e0;
  QString::fromUtf8(QVar12);
  QObject::setObjectName((QString *)pQVar6);
  QString::~QString(&local_e0);
  pQVar1 = (QWidget *)this->gridLayout;
  pQVar6 = this->editPlayer1;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_f4);
  QGridLayout::addWidget(pQVar1,(int)pQVar6,0,4,1,(QFlags_conflict *)0x1);
  pQVar5 = (QLabel *)operator_new(0x28);
  pQVar2 = local_18;
  QFlags<Qt::WindowType>::QFlags(&local_f8);
  QLabel::QLabel(pQVar5,(QWidget *)pQVar2,(QFlags_conflict *)(ulong)local_f8.i);
  this->player2Label = pQVar5;
  pQVar5 = this->player2Label;
  QByteArrayView::QByteArrayView<13ul>(&local_120,(char (*) [13])"player2Label");
  QVar13.m_data = (storage_type *)local_120.m_size;
  QVar13.m_size = (qsizetype)&local_110;
  QString::fromUtf8(QVar13);
  QObject::setObjectName((QString *)pQVar5);
  QString::~QString(&local_110);
  pQVar1 = (QWidget *)this->gridLayout;
  pQVar5 = this->player2Label;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_124);
  QGridLayout::addWidget(pQVar1,(int)pQVar5,1,1,1,(QFlags_conflict *)0x1);
  pQVar6 = (QLineEdit *)operator_new(0x28);
  QLineEdit::QLineEdit(pQVar6,(QWidget *)local_18);
  this->editPlayer2 = pQVar6;
  pQVar6 = this->editPlayer2;
  QByteArrayView::QByteArrayView<12ul>(&local_150,(char (*) [12])"editPlayer2");
  QVar14.m_data = (storage_type *)local_150.m_size;
  QVar14.m_size = (qsizetype)&local_140;
  QString::fromUtf8(QVar14);
  QObject::setObjectName((QString *)pQVar6);
  QString::~QString(&local_140);
  pQVar1 = (QWidget *)this->gridLayout;
  pQVar6 = this->editPlayer2;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_154);
  QGridLayout::addWidget(pQVar1,(int)pQVar6,1,4,1,(QFlags_conflict *)0x1);
  pQVar7 = (QDialogButtonBox *)operator_new(0x28);
  QDialogButtonBox::QDialogButtonBox(pQVar7,(QWidget *)local_18);
  this->buttonBox = pQVar7;
  pQVar7 = this->buttonBox;
  QByteArrayView::QByteArrayView<10ul>(&local_180,(char (*) [10])"buttonBox");
  QVar15.m_data = (storage_type *)local_180.m_size;
  QVar15.m_size = (qsizetype)&local_170;
  QString::fromUtf8(QVar15);
  QObject::setObjectName((QString *)pQVar7);
  QString::~QString(&local_170);
  QDialogButtonBox::setOrientation((Orientation)this->buttonBox);
  pQVar7 = this->buttonBox;
  local_184 = (Int)operator|(Cancel,FirstButton);
  QDialogButtonBox::setStandardButtons((QFlags_conflict *)pQVar7);
  pQVar1 = (QWidget *)this->gridLayout;
  pQVar7 = this->buttonBox;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_188);
  QGridLayout::addWidget(pQVar1,(int)pQVar7,3,1,1,(QFlags_conflict *)0x4);
  pQVar5 = (QLabel *)operator_new(0x28);
  pQVar2 = local_18;
  QFlags<Qt::WindowType>::QFlags(&local_18c);
  QLabel::QLabel(pQVar5,(QWidget *)pQVar2,(QFlags_conflict *)(ulong)local_18c.i);
  this->label = pQVar5;
  pQVar5 = this->label;
  QByteArrayView::QByteArrayView<6ul>(&local_1b8,(char (*) [6])"label");
  QVar16.m_data = (storage_type *)local_1b8.m_size;
  QVar16.m_size = (qsizetype)&local_1a8;
  QString::fromUtf8(QVar16);
  QObject::setObjectName((QString *)pQVar5);
  QString::~QString(&local_1a8);
  pQVar1 = (QWidget *)this->gridLayout;
  pQVar5 = this->label;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_1bc);
  QGridLayout::addWidget(pQVar1,(int)pQVar5,2,1,1,(QFlags_conflict *)0x1);
  pQVar8 = (QSpinBox *)operator_new(0x28);
  QSpinBox::QSpinBox(pQVar8,(QWidget *)local_18);
  this->spinBox = pQVar8;
  pQVar8 = this->spinBox;
  QByteArrayView::QByteArrayView<8ul>(&local_1e8,(char (*) [8])"spinBox");
  QVar17.m_data = (storage_type *)local_1e8.m_size;
  QVar17.m_size = (qsizetype)&local_1d8;
  QString::fromUtf8(QVar17);
  QObject::setObjectName((QString *)pQVar8);
  QString::~QString(&local_1d8);
  QSpinBox::setValue((int)this->spinBox);
  pQVar1 = (QWidget *)this->gridLayout;
  pQVar8 = this->spinBox;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_1ec);
  QGridLayout::addWidget(pQVar1,(int)pQVar8,2,4,1,(QFlags_conflict *)0x1);
  retranslateUi(this,local_18);
  pQVar2 = local_18;
  pQVar7 = this->buttonBox;
  local_200 = 0;
  local_208 = 0x1b9;
  local_228 = QNonConstOverload<>::operator()((QNonConstOverload<> *)&qOverload<>,0x1b9);
  local_218 = QDialogButtonBox::accepted;
  local_210 = 0;
  QObject::connect<void(QDialogButtonBox::*)(),void(QDialog::*)()>
            (local_1f8,(offset_in_QDialogButtonBox_to_subr)pQVar7,
             (Object *)QDialogButtonBox::accepted,0,(ConnectionType)pQVar2);
  QMetaObject::Connection::~Connection((Connection *)local_1f8);
  pQVar2 = local_18;
  pQVar7 = this->buttonBox;
  QNonConstOverload<>::operator()((QNonConstOverload<> *)&qOverload<>,0x1c1);
  QObject::connect<void(QDialogButtonBox::*)(),void(QDialog::*)()>
            (local_230,(offset_in_QDialogButtonBox_to_subr)pQVar7,
             (Object *)QDialogButtonBox::rejected,0,(ConnectionType)pQVar2);
  QMetaObject::Connection::~Connection((Connection *)local_230);
  QMetaObject::connectSlotsByName((QObject *)local_18);
  return;
}

Assistant:

void setupUi(QDialog *InitGameDialog)
    {
        if (InitGameDialog->objectName().isEmpty())
            InitGameDialog->setObjectName(QString::fromUtf8("InitGameDialog"));
        InitGameDialog->resize(400, 300);
        gridLayout = new QGridLayout(InitGameDialog);
        gridLayout->setObjectName(QString::fromUtf8("gridLayout"));
        player1Label = new QLabel(InitGameDialog);
        player1Label->setObjectName(QString::fromUtf8("player1Label"));

        gridLayout->addWidget(player1Label, 0, 1, 1, 1);

        editPlayer1 = new QLineEdit(InitGameDialog);
        editPlayer1->setObjectName(QString::fromUtf8("editPlayer1"));

        gridLayout->addWidget(editPlayer1, 0, 4, 1, 1);

        player2Label = new QLabel(InitGameDialog);
        player2Label->setObjectName(QString::fromUtf8("player2Label"));

        gridLayout->addWidget(player2Label, 1, 1, 1, 1);

        editPlayer2 = new QLineEdit(InitGameDialog);
        editPlayer2->setObjectName(QString::fromUtf8("editPlayer2"));

        gridLayout->addWidget(editPlayer2, 1, 4, 1, 1);

        buttonBox = new QDialogButtonBox(InitGameDialog);
        buttonBox->setObjectName(QString::fromUtf8("buttonBox"));
        buttonBox->setOrientation(Qt::Horizontal);
        buttonBox->setStandardButtons(QDialogButtonBox::Cancel|QDialogButtonBox::Ok);

        gridLayout->addWidget(buttonBox, 3, 1, 1, 4);

        label = new QLabel(InitGameDialog);
        label->setObjectName(QString::fromUtf8("label"));

        gridLayout->addWidget(label, 2, 1, 1, 1);

        spinBox = new QSpinBox(InitGameDialog);
        spinBox->setObjectName(QString::fromUtf8("spinBox"));
        spinBox->setValue(3);

        gridLayout->addWidget(spinBox, 2, 4, 1, 1);


        retranslateUi(InitGameDialog);
        QObject::connect(buttonBox, &QDialogButtonBox::accepted, InitGameDialog, qOverload<>(&QDialog::accept));
        QObject::connect(buttonBox, &QDialogButtonBox::rejected, InitGameDialog, qOverload<>(&QDialog::reject));

        QMetaObject::connectSlotsByName(InitGameDialog);
    }